

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20250127::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
::find_or_prepare_insert_soo<google::protobuf::compiler::SCC_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20250127::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
          *this,SCC **key)

{
  bool bVar1;
  uintptr_t v;
  slot_type *psVar2;
  size_t i;
  ulong uVar3;
  iterator iVar4;
  
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                   *)this);
  if (bVar1) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
    ::try_sample_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                      *)this);
    CommonFields::set_full_soo((CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
            ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                            *)this);
  }
  else {
    psVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                         *)this);
    if ((psVar2->value).first == *key) {
      iVar4 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                              *)this);
      bVar1 = false;
      goto LAB_00b0139e;
    }
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
    ::resize_impl(this,3);
    uVar3 = ((ulong)*key ^ 0x1694568) * -0x234dd359734ecb13;
    uVar3 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
    i = PrepareInsertAfterSoo
                  (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38,0x10,(CommonFields *)this);
    iVar4 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
            ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                           *)this,i);
  }
  bVar1 = true;
LAB_00b0139e:
  __return_storage_ptr__->first = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }